

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uchar *puVar12;
  CImgArgumentException *this_00;
  ulong uVar13;
  float *pfVar14;
  CImg<unsigned_char> *pCVar15;
  float extraout_XMM0_Da;
  int local_220;
  int local_208;
  int local_1f0;
  int local_1d8;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  float local_12c;
  float local_128;
  float local_124;
  float copacity;
  float nopacity;
  float mopacity;
  int x;
  uchar *ptrm;
  uchar *ptrs;
  uchar *ptrd;
  int local_f8;
  int y;
  int z;
  int c;
  ulongT msize;
  int local_e0;
  int lc;
  int lz;
  int ly;
  int lx;
  int sc0;
  int sz0;
  int sy0;
  int sx0;
  int dc0;
  int dz0;
  int dy0;
  int dx0;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  CImg<unsigned_char> local_80;
  float local_60;
  float local_5c;
  float mask_max_value_local;
  float opacity_local;
  CImg<unsigned_char> *sprite_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  local_60 = mask_max_value;
  local_5c = opacity;
  _mask_max_value_local = sprite;
  sprite_local._0_4_ = c0;
  sprite_local._4_4_ = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  bVar7 = is_empty(this);
  this_local = this;
  if (((!bVar7) &&
      (puVar12 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)_mask_max_value_local),
      puVar12 != (uchar *)0x0)) &&
     (puVar12 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)mask),
     puVar12 != (uchar *)0x0)) {
    bVar7 = is_overlapped<unsigned_char>(this,_mask_max_value_local);
    iVar9 = z0_local;
    iVar8 = c0_local;
    iVar6 = sprite_local._4_4_;
    iVar11 = (int)sprite_local;
    if (bVar7) {
      operator+(&local_80,_mask_max_value_local);
      this_local = draw_image<unsigned_char,unsigned_char>
                             (this,iVar9,iVar8,iVar6,iVar11,&local_80,mask,local_5c,local_60);
      ~CImg(&local_80);
    }
    else {
      bVar7 = is_overlapped<unsigned_char>(this,mask);
      iVar9 = z0_local;
      iVar8 = c0_local;
      iVar6 = sprite_local._4_4_;
      iVar11 = (int)sprite_local;
      pCVar15 = _mask_max_value_local;
      if (bVar7) {
        operator+((CImg<unsigned_char> *)&dx0,mask);
        this_local = draw_image<unsigned_char,unsigned_char>
                               (this,iVar9,iVar8,iVar6,iVar11,pCVar15,(CImg<unsigned_char> *)&dx0,
                                local_5c,local_60);
        ~CImg((CImg<unsigned_char> *)&dx0);
      }
      else {
        if (((mask->_width != _mask_max_value_local->_width) ||
            (mask->_height != _mask_max_value_local->_height)) ||
           (mask->_depth != _mask_max_value_local->_depth)) {
          this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          uVar1 = this->_width;
          uVar2 = this->_height;
          uVar3 = this->_depth;
          uVar4 = this->_spectrum;
          pixel_type();
          CImgArgumentException::CImgArgumentException
                    (this_00,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                     ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
          __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                      CImgArgumentException::~CImgArgumentException);
        }
        dy0._3_1_ = z0_local < 0;
        dy0._2_1_ = c0_local < 0;
        dy0._1_1_ = sprite_local._4_4_ < 0;
        dy0._0_1_ = (int)sprite_local < 0;
        if ((bool)dy0._3_1_) {
          local_1bc = 0;
        }
        else {
          local_1bc = z0_local;
        }
        dz0 = local_1bc;
        if ((bool)dy0._2_1_) {
          local_1c0 = 0;
        }
        else {
          local_1c0 = c0_local;
        }
        dc0 = local_1c0;
        if ((bool)dy0._1_1_) {
          local_1c4 = 0;
        }
        else {
          local_1c4 = sprite_local._4_4_;
        }
        sx0 = local_1c4;
        if ((bool)(undefined1)dy0) {
          local_1c8 = 0;
        }
        else {
          local_1c8 = (int)sprite_local;
        }
        sy0 = local_1c8;
        sz0 = local_1bc - z0_local;
        sc0 = local_1c0 - c0_local;
        lx = local_1c4 - sprite_local._4_4_;
        ly = local_1c8 - (int)sprite_local;
        iVar8 = width(_mask_max_value_local);
        iVar11 = z0_local;
        iVar8 = iVar8 - sz0;
        iVar9 = width(_mask_max_value_local);
        iVar10 = width(this);
        iVar6 = z0_local;
        if (iVar10 < iVar11 + iVar9) {
          iVar11 = width(_mask_max_value_local);
          local_1d8 = width(this);
          local_1d8 = (iVar6 + iVar11) - local_1d8;
        }
        else {
          local_1d8 = 0;
        }
        lz = iVar8 - local_1d8;
        iVar8 = height(_mask_max_value_local);
        iVar11 = c0_local;
        iVar8 = iVar8 - sc0;
        iVar9 = height(_mask_max_value_local);
        iVar10 = height(this);
        iVar6 = c0_local;
        if (iVar10 < iVar11 + iVar9) {
          iVar11 = height(_mask_max_value_local);
          local_1f0 = height(this);
          local_1f0 = (iVar6 + iVar11) - local_1f0;
        }
        else {
          local_1f0 = 0;
        }
        lc = iVar8 - local_1f0;
        iVar8 = depth(_mask_max_value_local);
        iVar11 = sprite_local._4_4_;
        iVar8 = iVar8 - lx;
        iVar9 = depth(_mask_max_value_local);
        iVar10 = depth(this);
        iVar6 = sprite_local._4_4_;
        if (iVar10 < iVar11 + iVar9) {
          iVar11 = depth(_mask_max_value_local);
          local_208 = depth(this);
          local_208 = (iVar6 + iVar11) - local_208;
        }
        else {
          local_208 = 0;
        }
        local_e0 = iVar8 - local_208;
        iVar8 = spectrum(_mask_max_value_local);
        iVar11 = (int)sprite_local;
        iVar8 = iVar8 - ly;
        iVar9 = spectrum(_mask_max_value_local);
        iVar10 = spectrum(this);
        iVar6 = (int)sprite_local;
        if (iVar10 < iVar11 + iVar9) {
          iVar11 = spectrum(_mask_max_value_local);
          local_220 = spectrum(this);
          local_220 = (iVar6 + iVar11) - local_220;
        }
        else {
          local_220 = 0;
        }
        msize._4_4_ = iVar8 - local_220;
        _z = size(mask);
        if (((0 < lz) && (0 < lc)) && ((0 < local_e0 && (0 < msize._4_4_)))) {
          for (y = 0; y < msize._4_4_; y = y + 1) {
            for (local_f8 = 0; local_f8 < local_e0; local_f8 = local_f8 + 1) {
              for (ptrd._4_4_ = 0; ptrd._4_4_ < lc; ptrd._4_4_ = ptrd._4_4_ + 1) {
                ptrs = data(this,dz0,dc0 + ptrd._4_4_,sx0 + local_f8,sy0 + y);
                ptrm = data(_mask_max_value_local,sz0,sc0 + ptrd._4_4_,lx + local_f8,ly + y);
                puVar12 = mask->_data;
                pCVar15 = mask;
                uVar13 = offset(mask,sz0,sc0 + ptrd._4_4_,lx + local_f8,ly + y);
                _mopacity = puVar12 + uVar13 % _z;
                for (nopacity = 0.0; (int)nopacity < lz; nopacity = (float)((int)nopacity + 1)) {
                  copacity = (float)*_mopacity * local_5c;
                  _mopacity = _mopacity + 1;
                  cimg::abs((int)pCVar15);
                  fVar5 = local_60;
                  local_12c = 0.0;
                  pCVar15 = (CImg<unsigned_char> *)&copacity;
                  local_124 = extraout_XMM0_Da;
                  pfVar14 = std::max<float>((float *)pCVar15,&local_12c);
                  local_128 = fVar5 - *pfVar14;
                  *ptrs = (uchar)(int)((local_124 * (float)*ptrm + (float)*ptrs * local_128) /
                                      local_60);
                  ptrs = ptrs + 1;
                  ptrm = ptrm + 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask)) return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have "
                                    "incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT msize = mask.size();

      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const ti *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              const tm *ptrm = mask._data + (mask.offset(sx0,sy0 + y,sz0 + z,sc0 + c)%msize);
              for (int x = 0; x<lx; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - std::max(mopacity,0.f);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
            }
      }
      return *this;
    }